

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_all_apis.cpp
# Opt level: O0

void __thiscall APITests::print_info(APITests *this)

{
  ostream *poVar1;
  char *pcVar2;
  long in_RDI;
  char *line;
  
  poVar1 = std::operator<<((ostream *)&std::cout,"==========================");
  std::ostream::operator<<(poVar1,std::endl<char,std::char_traits<char>>);
  poVar1 = std::operator<<((ostream *)&std::cout,"[Library Version] ");
  poVar1 = std::operator<<(poVar1,"1.2.5");
  std::ostream::operator<<(poVar1,std::endl<char,std::char_traits<char>>);
  poVar1 = std::operator<<((ostream *)&std::cout,"[Model] ");
  pcVar2 = GPIO::LazyString::operator_cast_to_char_((LazyString *)&GPIO::model);
  poVar1 = std::operator<<(poVar1,pcVar2);
  std::ostream::operator<<(poVar1,std::endl<char,std::char_traits<char>>);
  pcVar2 = GPIO::LazyString::operator_cast_to_char_((LazyString *)&GPIO::JETSON_INFO);
  std::operator<<((ostream *)&std::cout,pcVar2);
  poVar1 = std::operator<<((ostream *)&std::cout,"==========================");
  std::ostream::operator<<(poVar1,std::endl<char,std::char_traits<char>>);
  poVar1 = std::operator<<((ostream *)&std::cout,"[NOTE]");
  std::ostream::operator<<(poVar1,std::endl<char,std::char_traits<char>>);
  std::operator<<((ostream *)&std::cout,"For this test script to run correctly, ");
  poVar1 = std::operator<<((ostream *)&std::cout,"you must connect a wire between");
  std::ostream::operator<<(poVar1,std::endl<char,std::char_traits<char>>);
  std::operator<<((ostream *)&std::cout,"the pin the test uses for output(BOARD pin ");
  poVar1 = (ostream *)std::ostream::operator<<((ostream *)&std::cout,*(int *)(in_RDI + 0x20));
  std::operator<<(poVar1,")");
  poVar1 = std::operator<<((ostream *)&std::cout," and the pin the test uses for input(BOARD pin ");
  poVar1 = (ostream *)std::ostream::operator<<(poVar1,*(int *)(in_RDI + 0x24));
  std::operator<<(poVar1,").");
  std::ostream::operator<<((ostream *)&std::cout,std::endl<char,std::char_traits<char>>);
  poVar1 = std::operator<<((ostream *)&std::cout,"==========================");
  std::ostream::operator<<(poVar1,std::endl<char,std::char_traits<char>>);
  return;
}

Assistant:

void print_info()
    {
        const auto line = "==========================";

        std::cout << line << std::endl;
        std::cout << "[Library Version] " << GPIO::VERSION << std::endl;
        std::cout << "[Model] " << GPIO::model << std::endl;
        std::cout << GPIO::JETSON_INFO;
        std::cout << line << std::endl;

        std::cout << "[NOTE]" << std::endl;
        std::cout << "For this test script to run correctly, ";
        std::cout << "you must connect a wire between" << std::endl;
        std::cout << "the pin the test uses for output(BOARD pin ";
        std::cout << pin_data.out_a << ")";
        std::cout << " and the pin the test uses for input(BOARD pin " << pin_data.in_a << ").";
        std::cout << std::endl;

        std::cout << line << std::endl;
    }